

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::EliminateDeadMembersPass::GetNewMemberIndex
          (EliminateDeadMembersPass *this,uint32_t type_id,uint32_t member_idx)

{
  iterator iVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  uint32_t uVar4;
  bool bVar5;
  uint32_t local_1c;
  
  local_1c = type_id;
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->used_members_)._M_h,&local_1c);
  uVar4 = member_idx;
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    p_Var2 = *(_Rb_tree_node_base **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                     ._M_cur + 0x20);
    uVar4 = 0xffffffff;
    if (p_Var2 != (_Rb_tree_node_base *)0x0) {
      p_Var3 = (_Rb_tree_node_base *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                      ._M_cur + 0x18);
      do {
        bVar5 = p_Var2[1]._M_color < member_idx;
        if (!bVar5) {
          p_Var3 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[bVar5];
      } while (p_Var2 != (_Base_ptr)0x0);
      if ((p_Var3 != (_Rb_tree_node_base *)
                     ((long)iVar1.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                            ._M_cur + 0x18)) && (p_Var3[1]._M_color <= member_idx)) {
        p_Var2 = *(_Rb_tree_node_base **)
                  ((long)iVar1.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                         ._M_cur + 0x28);
        uVar4 = 0;
        while (p_Var2 != p_Var3) {
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
          uVar4 = uVar4 + 1;
        }
      }
    }
  }
  return uVar4;
}

Assistant:

uint32_t EliminateDeadMembersPass::GetNewMemberIndex(uint32_t type_id,
                                                     uint32_t member_idx) {
  auto live_members = used_members_.find(type_id);
  if (live_members == used_members_.end()) {
    return member_idx;
  }

  auto current_member = live_members->second.find(member_idx);
  if (current_member == live_members->second.end()) {
    return kRemovedMember;
  }

  return static_cast<uint32_t>(
      std::distance(live_members->second.begin(), current_member));
}